

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_add_rst_stream(nghttp2_session *session,int32_t stream_id,uint32_t error_code)

{
  int iVar1;
  nghttp2_stream *pnVar2;
  nghttp2_outbound_item *pnVar3;
  nghttp2_frame *headers_frame;
  nghttp2_headers_aux_data *aux_data;
  nghttp2_mem *mem;
  nghttp2_stream *stream;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  int rv;
  uint32_t error_code_local;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  pnVar2 = nghttp2_session_get_stream(session,stream_id);
  if ((pnVar2 == (nghttp2_stream *)0x0) || (pnVar2->state != NGHTTP2_STREAM_CLOSING)) {
    iVar1 = nghttp2_session_is_my_stream_id(session,stream_id);
    if (iVar1 == 0) {
      if (session->last_recv_stream_id < stream_id) {
        return 0;
      }
    }
    else if (session->next_stream_id <= (uint)stream_id) {
      return 0;
    }
    if (((session->server == '\0') &&
        (iVar1 = nghttp2_session_is_my_stream_id(session,stream_id), iVar1 != 0)) &&
       ((session->ob_syn).head != (nghttp2_outbound_item *)0x0)) {
      pnVar3 = (session->ob_syn).head;
      if ((pnVar3->frame).hd.type != '\x01') {
        __assert_fail("headers_frame->hd.type == NGHTTP2_HEADERS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0x4de,
                      "int nghttp2_session_add_rst_stream(nghttp2_session *, int32_t, uint32_t)");
      }
      if ((pnVar3->frame).hd.stream_id <= stream_id) {
        for (frame = &((session->ob_syn).head)->frame; frame != (nghttp2_frame *)0x0;
            frame = *(nghttp2_frame **)((long)frame + 0x88)) {
          if (stream_id <= (frame->hd).stream_id) {
            if (((frame->hd).stream_id <= stream_id) && (*(char *)((long)frame + 0x7c) == '\0')) {
              *(uint32_t *)((long)frame + 0x78) = error_code;
              *(undefined1 *)((long)frame + 0x7c) = 1;
              return 0;
            }
            break;
          }
        }
      }
    }
    pnVar3 = (nghttp2_outbound_item *)nghttp2_mem_malloc(&session->mem,0x98);
    if (pnVar3 == (nghttp2_outbound_item *)0x0) {
      session_local._4_4_ = -0x385;
    }
    else {
      nghttp2_outbound_item_init(pnVar3);
      nghttp2_frame_rst_stream_init((nghttp2_rst_stream *)pnVar3,stream_id,error_code);
      session_local._4_4_ = nghttp2_session_add_item(session,pnVar3);
      if (session_local._4_4_ == 0) {
        session_local._4_4_ = 0;
      }
      else {
        nghttp2_frame_rst_stream_free((nghttp2_rst_stream *)pnVar3);
        nghttp2_mem_free(&session->mem,pnVar3);
      }
    }
  }
  else {
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_add_rst_stream(nghttp2_session *session, int32_t stream_id,
                                   uint32_t error_code) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_stream *stream;
  nghttp2_mem *mem;

  mem = &session->mem;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream && stream->state == NGHTTP2_STREAM_CLOSING) {
    return 0;
  }

  /* Sending RST_STREAM to an idle stream is subject to protocol
     violation.  Historically, nghttp2 allows this.  In order not to
     disrupt the existing applications, we don't error out this case
     and simply ignore it. */
  if (nghttp2_session_is_my_stream_id(session, stream_id)) {
    if ((uint32_t)stream_id >= session->next_stream_id) {
      return 0;
    }
  } else if (session->last_recv_stream_id < stream_id) {
    return 0;
  }

  /* Cancel pending request HEADERS in ob_syn if this RST_STREAM
     refers to that stream. */
  if (!session->server && nghttp2_session_is_my_stream_id(session, stream_id) &&
      nghttp2_outbound_queue_top(&session->ob_syn)) {
    nghttp2_headers_aux_data *aux_data;
    nghttp2_frame *headers_frame;

    headers_frame = &nghttp2_outbound_queue_top(&session->ob_syn)->frame;
    assert(headers_frame->hd.type == NGHTTP2_HEADERS);

    if (headers_frame->hd.stream_id <= stream_id) {

      for (item = session->ob_syn.head; item; item = item->qnext) {
        aux_data = &item->aux_data.headers;

        if (item->frame.hd.stream_id < stream_id) {
          continue;
        }

        /* stream_id in ob_syn queue must be strictly increasing.  If
           we found larger ID, then we can break here. */
        if (item->frame.hd.stream_id > stream_id || aux_data->canceled) {
          break;
        }

        aux_data->error_code = error_code;
        aux_data->canceled = 1;

        return 0;
      }
    }
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_rst_stream_init(&frame->rst_stream, stream_id, error_code);
  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_rst_stream_free(&frame->rst_stream);
    nghttp2_mem_free(mem, item);
    return rv;
  }
  return 0;
}